

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.cpp
# Opt level: O0

void __thiscall
Ptex::v2_4::PtexReader::TiledFaceBase::getPixel(TiledFaceBase *this,int ui,int vi,void *result)

{
  PtexFaceData *pPVar1;
  undefined8 in_RCX;
  int in_EDX;
  int in_ESI;
  PtexPtr<Ptex::v2_4::PtexFaceData> *in_RDI;
  PtexPtr<Ptex::v2_4::PtexFaceData> tile;
  int tilev;
  int tileu;
  PtexPtr<Ptex::v2_4::PtexFaceData> local_28;
  int local_20;
  int local_1c;
  undefined8 local_18;
  int local_10;
  int local_c;
  
  local_1c = in_ESI >> (*(byte *)&in_RDI[3]._ptr & 0x1f);
  local_20 = in_EDX >> (*(byte *)((long)&in_RDI[3]._ptr + 1) & 0x1f);
  local_18 = in_RCX;
  local_10 = in_EDX;
  local_c = in_ESI;
  pPVar1 = (PtexFaceData *)
           (*(code *)in_RDI->_ptr[9]._vptr_PtexFaceData)
                     (in_RDI,local_20 * *(int *)((long)&in_RDI[4]._ptr + 4) + local_1c);
  PtexPtr<Ptex::v2_4::PtexFaceData>::PtexPtr(&local_28,pPVar1);
  pPVar1 = PtexPtr<Ptex::v2_4::PtexFaceData>::operator->(&local_28);
  (*pPVar1->_vptr_PtexFaceData[5])
            (pPVar1,(ulong)(uint)(local_c - (local_1c << (*(byte *)&in_RDI[3]._ptr & 0x1f))),
             (ulong)(uint)(local_10 - (local_20 << (*(byte *)((long)&in_RDI[3]._ptr + 1) & 0x1f))),
             local_18);
  PtexPtr<Ptex::v2_4::PtexFaceData>::~PtexPtr(in_RDI);
  return;
}

Assistant:

void PtexReader::TiledFaceBase::getPixel(int ui, int vi, void* result)
{
    int tileu = ui >> _tileres.ulog2;
    int tilev = vi >> _tileres.vlog2;
    PtexPtr<PtexFaceData> tile ( getTile(tilev * _ntilesu + tileu) );
    tile->getPixel(ui - (tileu<<_tileres.ulog2),
                   vi - (tilev<<_tileres.vlog2), result);
}